

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void speech_prog_cimar_dollgirl(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  char *pcVar4;
  CHAR_DATA *in_RSI;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  void *in_stack_ffffffffffffedd0;
  char *__s;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede4;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffedf8;
  
  bVar2 = is_npc(in_stack_ffffffffffffedc8);
  if (((!bVar2) &&
      (bVar2 = can_see(in_stack_ffffffffffffede8,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0)),
      bVar2)) && (bVar2 = can_do_quest(in_stack_ffffffffffffedc8,0), bVar2)) {
    sVar1 = in_RSI->pcdata->quests[1];
    iVar3 = (int)sVar1;
    if (sVar1 == 0) {
      bVar2 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      if (bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
        if (!bVar2) {
          act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
              in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
          in_RSI->pcdata->quests[1] = 2;
          in_RSI->pcdata->reputation = in_RSI->pcdata->reputation + -10;
        }
      }
      else {
        do_emote((CHAR_DATA *)buf._4544_8_,(char *)buf._4536_8_);
        act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
            in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
        __s = &stack0xffffffffffffede8;
        ch_00 = (CHAR_DATA *)
                get_char_color(in_stack_ffffffffffffede8,
                               (char *)CONCAT44(iVar3,in_stack_ffffffffffffede0));
        pcVar4 = END_COLOR(ch_00);
        sprintf(__s,
                "A red-eyed girl says \'%sI lost it somewhere on Wormwood Avenue... I saw a rat, and it tried to bite me, so I ran away... and I think I dropped my doll somewhere b-by the sewer g-grate....%s\'\n\r"
                ,ch_00,pcVar4);
        send_to_char((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),ch_00);
        do_emote((CHAR_DATA *)buf._4544_8_,(char *)buf._4536_8_);
        in_RSI->pcdata->quests[1] = 1;
      }
    }
    else if (iVar3 == 1) {
      bVar2 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      if (bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
        if (!bVar2) {
          do_emote((CHAR_DATA *)buf._4544_8_,(char *)buf._4536_8_);
        }
      }
      else {
        bVar2 = is_carrying(in_RSI,0x8fa);
        if (bVar2) {
          do_emote((CHAR_DATA *)buf._4544_8_,(char *)buf._4536_8_);
          do_say((CHAR_DATA *)buf._312_8_,(char *)buf._304_8_);
        }
        else {
          act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
              in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
          act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
              in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
          do_say((CHAR_DATA *)buf._312_8_,(char *)buf._304_8_);
          act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
              in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
          act((char *)CONCAT44(iVar3,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
              in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,0);
          in_RSI->pcdata->quests[1] = 3;
          in_RSI->pcdata->reputation = in_RSI->pcdata->reputation + -0xf;
        }
      }
    }
  }
  return;
}

Assistant:

void speech_prog_cimar_dollgirl(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (!can_see(mob, ch))
		return;

	if (!can_do_quest(ch, DOLL_QUEST))
		return;

	switch (ch->pcdata->quests[DOLL_QUEST])
	{
		case 0:
			if (!str_prefix("yes", speech))
			{
				do_emote(mob, "'s eyes light up and gleam with hope.");
				act("$n approaches $N and murmurs something to $M.", mob, 0, ch, TO_NOTVICT);

				sprintf(buf,
					"A red-eyed girl says '%sI lost it somewhere on Wormwood Avenue... I saw a rat, and it tried to bite "\
					"me, so I ran away... and I think I dropped my doll somewhere b-by the sewer g-grate....%s'\n\r",
					get_char_color(ch, "speech"), END_COLOR(ch));
				send_to_char(buf, ch);

				do_emote(mob, "begins to bawl once more.");

				ch->pcdata->quests[DOLL_QUEST] = 1;
				break;
			}

			if (!str_prefix("no", speech))
			{
				act("A brief look of shock crosses $n's face and she turns away, sobbing.", mob, 0, 0, TO_ROOM);

				ch->pcdata->quests[DOLL_QUEST] = 2;
				ch->pcdata->reputation -= 10;
				break;
			}

			break;
		case 1:
			if (!str_prefix("yes", speech))
			{
				if (is_carrying(ch, 2298))
				{
					do_emote(mob, "squeaks with delight and extends one wavering hand.");
					do_say(mob, "Please?");
				}
				else
				{
					act("$n stops crying suddenly and studies your face for a moment.", mob, 0, ch, TO_VICT);
					act("$n stops crying suddenly and studies $N's face for a moment.", mob, 0, ch, TO_NOTVICT);
					do_say(mob, "Why... would you l-lie to me?  W-why?");

					act("$n turns away from you and wails pitifully.", mob, 0, ch, TO_VICT);
					act("$n turns away from $N and wails pitifully.", mob, 0, ch, TO_NOTVICT);

					ch->pcdata->quests[DOLL_QUEST] = 3;
					ch->pcdata->reputation -= 15;
				}

				break;
			}

			if (!str_prefix("no", speech))
			{
				do_emote(mob, "sniffs and continues crying loudly, wailing into a corner.");
				break;
			}
	}
}